

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool Fossilize::merge_concurrent_databases_last_use
               (char *append_archive,char **source_paths,size_t num_source_paths,
               bool skip_missing_inputs)

{
  pointer __n;
  bool bVar1;
  uint uVar2;
  DatabaseInterface *pDVar3;
  pointer pDVar4;
  unsigned_long *puVar5;
  __node_base_ptr *this;
  reference ppVar6;
  __node_base_ptr *local_370;
  tuple<Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  local_348;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_330;
  pair<const_unsigned_long,_unsigned_long> *t;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *__range2;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *ts;
  ResourceTag tag_1;
  uint i_1;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  write_db;
  mapped_type *entry;
  uint64_t timestamp;
  size_t timestamp_size;
  unsigned_long *hash;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  undefined1 local_2b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  size_t hash_count;
  uint local_288;
  ResourceTag tag;
  uint i;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  source_db;
  char *path;
  size_t source;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  timestamps [10];
  bool skip_missing_inputs_local;
  size_t num_source_paths_local;
  char **source_paths_local;
  char *append_archive_local;
  
  local_330 = (unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               *)&source;
  do {
    std::
    unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::unordered_map(local_330);
    local_330 = local_330 + 1;
  } while (local_330 !=
           (unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            *)&timestamps[9]._M_h._M_single_bucket);
  for (path = (char *)0x0; path < (char *)(num_source_paths + 1); path = path + 1) {
    local_348.
    super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
    .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
          )(_Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
            )append_archive;
    if (path != (char *)0x0) {
      local_348.
      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
           ((tuple<Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             *)(source_paths + (long)(path + -1)))->
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      ;
    }
    source_db._M_t.
    super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
    ._M_t.
    super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
    .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
         (__uniq_ptr_data<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>,_true,_true>
          )(__uniq_ptr_data<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>,_true,_true>
            )local_348.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    pDVar3 = create_stream_archive_database
                       ((char *)local_348.
                                super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                                .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>.
                                _M_head_impl,ReadOnly);
    std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
    ::unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
              ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
                *)&i,pDVar3);
    pDVar4 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                           *)&i);
    uVar2 = (*pDVar4->_vptr_DatabaseInterface[2])();
    if ((uVar2 & 1) == 0) {
      if (path == (char *)0x0) {
        tag = RESOURCE_SHADER_MODULE;
      }
      else if (skip_missing_inputs) {
        fprintf(_stderr,"Fossilize WARN: Archive %s could not be prepared, skipping.\n",
                source_db._M_t.
                super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                ._M_t.
                super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl);
        tag = RESOURCE_SHADER_MODULE;
      }
      else {
        append_archive_local._7_1_ = 0;
        tag = RESOURCE_SAMPLER;
      }
    }
    else {
      for (local_288 = 0; local_288 < 10; local_288 = local_288 + 1) {
        hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pDVar4 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                               *)&i);
        uVar2 = (*pDVar4->_vptr_DatabaseInterface[6])
                          (pDVar4,(ulong)local_288,
                           &hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        __n = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
        if ((uVar2 & 1) == 0) {
          append_archive_local._7_1_ = 0;
          tag = RESOURCE_SAMPLER;
          goto LAB_001c186a;
        }
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&__range3 + 7));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0,(size_type)__n
                   ,(allocator_type *)((long)&__range3 + 7));
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&__range3 + 7))
        ;
        pDVar4 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                               *)&i);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0);
        uVar2 = (*pDVar4->_vptr_DatabaseInterface[6])
                          (pDVar4,(ulong)local_288,
                           &hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((uVar2 & 1) == 0) {
          append_archive_local._7_1_ = 0;
          tag = RESOURCE_SAMPLER;
        }
        else {
          __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0);
          hash = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                             *)&hash), bVar1) {
            timestamp_size =
                 (size_t)__gnu_cxx::
                         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ::operator*(&__end3);
            timestamp = 8;
            entry = (mapped_type *)0x0;
            pDVar4 = std::
                     unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                   *)&i);
            uVar2 = (*pDVar4->_vptr_DatabaseInterface[3])
                              (pDVar4,(ulong)local_288,*(undefined8 *)timestamp_size,&timestamp,
                               &entry,0);
            if (((uVar2 & 1) == 0) || (timestamp != 8)) {
              append_archive_local._7_1_ = 0;
              tag = RESOURCE_SAMPLER;
              goto LAB_001c1832;
            }
            write_db._M_t.
            super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
            ._M_t.
            super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
            .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
                 (__uniq_ptr_data<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>,_true,_true>
                  )std::
                   unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   ::operator[]((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                 *)&timestamps[(ulong)local_288 - 1]._M_h._M_single_bucket,
                                (key_type *)timestamp_size);
            puVar5 = std::max<unsigned_long>
                               ((unsigned_long *)
                                write_db._M_t.
                                super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                                .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>.
                                _M_head_impl,(unsigned_long *)&entry);
            *(unsigned_long *)
             write_db._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl = *puVar5;
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&__end3);
          }
          tag = RESOURCE_APPLICATION_INFO;
        }
LAB_001c1832:
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0);
        if (tag != RESOURCE_APPLICATION_INFO) goto LAB_001c186a;
      }
      tag = RESOURCE_APPLICATION_INFO;
    }
LAB_001c186a:
    std::
    unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>::
    ~unique_ptr((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 *)&i);
    if ((tag != RESOURCE_APPLICATION_INFO) && (tag != RESOURCE_SHADER_MODULE)) goto LAB_001c1a2d;
  }
  pDVar3 = create_stream_archive_database(append_archive,OverWrite);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&tag_1,pDVar3);
  pDVar4 = std::
           unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                         *)&tag_1);
  uVar2 = (*pDVar4->_vptr_DatabaseInterface[2])();
  if ((uVar2 & 1) == 0) {
    append_archive_local._7_1_ = 0;
  }
  else {
    for (ts._4_4_ = 0; ts._4_4_ < 10; ts._4_4_ = ts._4_4_ + 1) {
      this = &timestamps[(ulong)ts._4_4_ - 1]._M_h._M_single_bucket;
      __end2 = std::
               unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::begin((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                        *)this);
      t = (pair<const_unsigned_long,_unsigned_long> *)
          std::
          unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::end((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 *)this);
      while (bVar1 = std::__detail::operator!=
                               (&__end2.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                ,(_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                  *)&t), bVar1) {
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>::
                 operator*(&__end2);
        pDVar4 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                               *)&tag_1);
        uVar2 = (*pDVar4->_vptr_DatabaseInterface[4])
                          (pDVar4,(ulong)ts._4_4_,ppVar6->first,&ppVar6->second,8,8);
        if ((uVar2 & 1) == 0) {
          append_archive_local._7_1_ = 0;
          goto LAB_001c1a21;
        }
        std::__detail::_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>::
        operator++(&__end2);
      }
    }
    append_archive_local._7_1_ = 1;
  }
LAB_001c1a21:
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 *)&tag_1);
LAB_001c1a2d:
  local_370 = &timestamps[9]._M_h._M_single_bucket;
  do {
    local_370 = local_370 + -7;
    std::
    unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::~unordered_map((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      *)local_370);
  } while (local_370 != (__node_base_ptr *)&source);
  return (bool)(append_archive_local._7_1_ & 1);
}

Assistant:

bool merge_concurrent_databases_last_use(const char *append_archive, const char * const *source_paths, size_t num_source_paths,
                                         bool skip_missing_inputs)
{
	std::unordered_map<Hash, uint64_t> timestamps[RESOURCE_COUNT];

	for (size_t source = 0; source < num_source_paths + 1; source++)
	{
		const char *path = source ? source_paths[source - 1] : append_archive;
		auto source_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(path, DatabaseMode::ReadOnly));
		if (!source_db->prepare())
		{
			if (source == 0)
				continue;
			else
			{
				if (!skip_missing_inputs)
					return false;

				LOGW("Archive %s could not be prepared, skipping.\n", path);
				continue;
			}
		}

		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = static_cast<ResourceTag>(i);

			size_t hash_count = 0;
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
				return false;
			std::vector<Hash> hashes(hash_count);
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
				return false;

			for (auto &hash : hashes)
			{
				size_t timestamp_size = sizeof(uint64_t);
				uint64_t timestamp = 0;
				if (!source_db->read_entry(tag, hash, &timestamp_size, &timestamp, PAYLOAD_READ_NO_FLAGS) ||
				    timestamp_size != sizeof(uint64_t))
					return false;

				auto &entry = timestamps[i][hash];
				entry = std::max<uint64_t>(entry, timestamp);
			}
		}
	}

	auto write_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(append_archive, DatabaseMode::OverWrite));
	if (!write_db->prepare())
		return false;

	for (unsigned i = 0; i < RESOURCE_COUNT; i++)
	{
		auto tag = static_cast<ResourceTag>(i);
		auto &ts = timestamps[i];

		for (auto &t : ts)
			if (!write_db->write_entry(tag, t.first, &t.second, sizeof(t.second), PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT))
				return false;
	}

	return true;
}